

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O3

void __thiscall SymmetricAlgorithm::SymmetricAlgorithm(SymmetricAlgorithm *this)

{
  this->_vptr_SymmetricAlgorithm = (_func_int **)&PTR__SymmetricAlgorithm_0019bcf0;
  ByteString::ByteString(&this->currentAEADBuffer);
  this->currentKey = (SymmetricKey *)0x0;
  this->currentCipherMode = Unknown;
  this->currentPaddingMode = true;
  this->currentBufferSize = 0;
  this->currentCounterBits = 0;
  this->currentTagBytes = 0;
  this->currentOperation = NONE;
  return;
}

Assistant:

SymmetricAlgorithm::SymmetricAlgorithm()
{
	currentKey = NULL;
	currentCipherMode = SymMode::Unknown;
	currentPaddingMode = true;
	currentCounterBits = 0;
	currentTagBytes = 0;
	currentOperation = NONE;
	currentBufferSize = 0;
}